

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int addreturn(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  size_t size;
  int status;
  char *retline;
  char *line;
  lua_State *L_local;
  
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  __s = lua_pushfstring(L,"return %s;",pcVar2);
  size = strlen(__s);
  iVar1 = luaL_loadbufferx(L,__s,size,"=stdin",(char *)0x0);
  if (iVar1 == 0) {
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    if (*pcVar2 != '\0') {
      add_history(pcVar2);
    }
  }
  else {
    lua_settop(L,-3);
  }
  return iVar1;
}

Assistant:

static int addreturn (lua_State *L) {
  const char *line = lua_tostring(L, -1);  /* original line */
  const char *retline = lua_pushfstring(L, "return %s;", line);
  int status = luaL_loadbuffer(L, retline, strlen(retline), "=stdin");
  if (status == LUA_OK) {
    lua_remove(L, -2);  /* remove modified line */
    if (line[0] != '\0')  /* non empty? */
      lua_saveline(L, line);  /* keep history */
  }
  else
    lua_pop(L, 2);  /* pop result from 'luaL_loadbuffer' and modified line */
  return status;
}